

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O0

bool __thiscall AnyType::OutputFromType<T61String>(AnyType *this,ostream *os)

{
  bool bVar1;
  undefined1 local_48 [7];
  bool fConverted;
  T61String t;
  ostream *os_local;
  AnyType *this_local;
  
  t.value.field_2._8_8_ = os;
  T61String::T61String((T61String *)local_48);
  bVar1 = ConvertToType<T61String>(this,(T61String *)local_48);
  if (bVar1) {
    ::operator<<((ostream *)t.value.field_2._8_8_,(T61String *)local_48);
  }
  T61String::~T61String((T61String *)local_48);
  return bVar1;
}

Assistant:

bool OutputFromType(std::ostream& os) const 
    {
        T t;
        bool fConverted = ConvertToType(t);
        if (fConverted)
            os << t;

        return fConverted;
    }